

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece.pb.cc
# Opt level: O2

size_t __thiscall
sentencepiece::SentencePieceText_SentencePiece::ByteSizeLong(SentencePieceText_SentencePiece *this)

{
  void *pvVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  size_t sVar5;
  size_t sVar6;
  
  sVar5 = google::protobuf::internal::ExtensionSet::ByteSize(&this->_extensions_);
  uVar4 = (this->_has_bits_).has_bits_[0];
  if ((uVar4 & 0x1f) != 0) {
    if ((uVar4 & 1) != 0) {
      sVar6 = google::protobuf::internal::WireFormatLite::StringSize
                        ((string *)((ulong)(this->piece_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
      sVar5 = sVar5 + sVar6 + 1;
    }
    if ((uVar4 & 2) != 0) {
      sVar6 = google::protobuf::internal::WireFormatLite::StringSize
                        ((string *)((ulong)(this->surface_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
      sVar5 = sVar5 + sVar6 + 1;
    }
    if ((uVar4 & 4) != 0) {
      uVar3 = this->id_ | 1;
      iVar2 = 0x1f;
      if (uVar3 != 0) {
        for (; uVar3 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      sVar5 = sVar5 + (iVar2 * 9 + 0x49U >> 6) + 1;
    }
    if ((uVar4 & 8) != 0) {
      uVar3 = this->begin_ | 1;
      iVar2 = 0x1f;
      if (uVar3 != 0) {
        for (; uVar3 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      sVar5 = sVar5 + (iVar2 * 9 + 0x49U >> 6) + 1;
    }
    if ((uVar4 & 0x10) != 0) {
      uVar4 = this->end_ | 1;
      iVar2 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      sVar5 = sVar5 + (iVar2 * 9 + 0x49U >> 6) + 1;
    }
  }
  pvVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    sVar5 = sVar5 + *(long *)(((ulong)pvVar1 & 0xfffffffffffffffe) + 0x10);
  }
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = (__int_type_conflict1)sVar5;
  return sVar5;
}

Assistant:

size_t SentencePieceText_SentencePiece::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:sentencepiece.SentencePieceText.SentencePiece)
  size_t total_size = 0;

  total_size += _extensions_.ByteSize();

  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  if (cached_has_bits & 0x0000001fu) {
    // optional string piece = 1;
    if (cached_has_bits & 0x00000001u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_piece());
    }

    // optional string surface = 3;
    if (cached_has_bits & 0x00000002u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_surface());
    }

    // optional uint32 id = 2;
    if (cached_has_bits & 0x00000004u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::UInt32Size(
          this->_internal_id());
    }

    // optional uint32 begin = 4;
    if (cached_has_bits & 0x00000008u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::UInt32Size(
          this->_internal_begin());
    }

    // optional uint32 end = 5;
    if (cached_has_bits & 0x00000010u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::UInt32Size(
          this->_internal_end());
    }

  }
  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    total_size += _internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size();
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}